

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

void __thiscall icu_63::DNCache::DNCache(DNCache *this,Locale *_locale)

{
  Locale *_locale_local;
  DNCache *this_local;
  
  Hashtable::Hashtable(&this->cache);
  Locale::Locale(&this->locale,_locale);
  return;
}

Assistant:

DNCache(const Locale& _locale) 
        : cache(), locale(_locale) 
    {
        // cache.setKeyDeleter(uprv_deleteUObject);
    }